

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::PipelinePopper::~PipelinePopper(PipelinePopper *this)

{
  value_type pPVar1;
  element_type *peVar2;
  size_type sVar3;
  reference ppPVar4;
  unsigned_long_long uVar5;
  Count *local_88;
  Pl_MD5 *local_68;
  long local_58;
  Count *local_30;
  Pipeline *p;
  PipelinePopper *this_local;
  
  if (this->stack_id != 0) {
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this->qw);
    sVar3 = std::vector<Pipeline_*,_std::allocator<Pipeline_*>_>::size(&peVar2->pipeline_stack);
    if (sVar3 < 2) {
      __assert_fail("qw->m->pipeline_stack.size() >= 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFWriter.cc"
                    ,0x3be,"QPDFWriter::PipelinePopper::~PipelinePopper()");
    }
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this->qw);
    ::qpdf::pl::Count::finish(peVar2->pipeline);
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this->qw);
    ppPVar4 = std::vector<Pipeline_*,_std::allocator<Pipeline_*>_>::back(&peVar2->pipeline_stack);
    if (*ppPVar4 == (value_type)0x0) {
      local_30 = (Count *)0x0;
    }
    else {
      local_30 = (Count *)__dynamic_cast(*ppPVar4,&Pipeline::typeinfo,&::qpdf::pl::Count::typeinfo,0
                                        );
    }
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this->qw);
    if (local_30 != peVar2->pipeline) {
      __assert_fail("dynamic_cast<pl::Count*>(qw->m->pipeline_stack.back()) == qw->m->pipeline",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFWriter.cc"
                    ,0x3c0,"QPDFWriter::PipelinePopper::~PipelinePopper()");
    }
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this->qw);
    uVar5 = ::qpdf::pl::Count::id(peVar2->pipeline);
    if (uVar5 != this->stack_id) {
      __assert_fail("qw->m->pipeline->id() == stack_id",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFWriter.cc"
                    ,0x3c5,"QPDFWriter::PipelinePopper::~PipelinePopper()");
    }
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this->qw);
    ppPVar4 = std::vector<Pipeline_*,_std::allocator<Pipeline_*>_>::back(&peVar2->pipeline_stack);
    if (*ppPVar4 != (value_type)0x0) {
      (*(*ppPVar4)->_vptr_Pipeline[1])();
    }
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this->qw);
    std::vector<Pipeline_*,_std::allocator<Pipeline_*>_>::pop_back(&peVar2->pipeline_stack);
    while( true ) {
      peVar2 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this->qw);
      ppPVar4 = std::vector<Pipeline_*,_std::allocator<Pipeline_*>_>::back(&peVar2->pipeline_stack);
      if (*ppPVar4 == (value_type)0x0) {
        local_58 = 0;
      }
      else {
        local_58 = __dynamic_cast(*ppPVar4,&Pipeline::typeinfo,&::qpdf::pl::Count::typeinfo,0);
      }
      if (local_58 != 0) break;
      peVar2 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this->qw);
      ppPVar4 = std::vector<Pipeline_*,_std::allocator<Pipeline_*>_>::back(&peVar2->pipeline_stack);
      pPVar1 = *ppPVar4;
      if (pPVar1 == (value_type)0x0) {
        local_68 = (Pl_MD5 *)0x0;
      }
      else {
        local_68 = (Pl_MD5 *)__dynamic_cast(pPVar1,&Pipeline::typeinfo,&Pl_MD5::typeinfo,0);
      }
      peVar2 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this->qw);
      if (local_68 == peVar2->md5_pipeline) {
        peVar2 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this->qw);
        peVar2->md5_pipeline = (Pl_MD5 *)0x0;
      }
      peVar2 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this->qw);
      std::vector<Pipeline_*,_std::allocator<Pipeline_*>_>::pop_back(&peVar2->pipeline_stack);
      if (pPVar1 != (value_type)0x0) {
        (*pPVar1->_vptr_Pipeline[1])();
      }
    }
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this->qw);
    ppPVar4 = std::vector<Pipeline_*,_std::allocator<Pipeline_*>_>::back(&peVar2->pipeline_stack);
    if (*ppPVar4 == (value_type)0x0) {
      local_88 = (Count *)0x0;
    }
    else {
      local_88 = (Count *)__dynamic_cast(*ppPVar4,&Pipeline::typeinfo,&::qpdf::pl::Count::typeinfo,0
                                        );
    }
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this->qw);
    peVar2->pipeline = local_88;
  }
  return;
}

Assistant:

QPDFWriter::PipelinePopper::~PipelinePopper()
{
    if (!stack_id) {
        return;
    }
    qpdf_assert_debug(qw->m->pipeline_stack.size() >= 2);
    qw->m->pipeline->finish();
    qpdf_assert_debug(dynamic_cast<pl::Count*>(qw->m->pipeline_stack.back()) == qw->m->pipeline);
    // It might be possible for this assertion to fail if writeLinearized exits by exception when
    // deterministic ID, but I don't think so. As of this writing, this is the only case in which
    // two dynamically allocated PipelinePopper objects ever exist at the same time, so the
    // assertion will fail if they get popped out of order from automatic destruction.
    qpdf_assert_debug(qw->m->pipeline->id() == stack_id);
    delete qw->m->pipeline_stack.back();
    qw->m->pipeline_stack.pop_back();
    while (!dynamic_cast<pl::Count*>(qw->m->pipeline_stack.back())) {
        Pipeline* p = qw->m->pipeline_stack.back();
        if (dynamic_cast<Pl_MD5*>(p) == qw->m->md5_pipeline) {
            qw->m->md5_pipeline = nullptr;
        }
        qw->m->pipeline_stack.pop_back();
        delete p;
    }
    qw->m->pipeline = dynamic_cast<pl::Count*>(qw->m->pipeline_stack.back());
}